

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_node.cpp
# Opt level: O1

string * __thiscall
duckdb::CommonTableExpressionMap::ToString_abi_cxx11_
          (string *__return_storage_ptr__,CommonTableExpressionMap *this)

{
  unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>
  *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer ppVar3;
  pointer pCVar4;
  pointer pSVar5;
  pointer pQVar6;
  type this_00;
  reference text;
  reference this_01;
  pointer pPVar7;
  bool bVar8;
  pointer ppVar9;
  size_type __n;
  pointer ppVar10;
  size_type __n_00;
  InsertionOrderPreservingMap<duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>
  *__range1;
  string local_70;
  unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>
  *local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  pointer local_40;
  pointer local_38;
  
  if ((this->map).map_idx._M_h._M_element_count == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    ppVar10 = (this->map).map.
              super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
              .
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppVar3 = (this->map).map.
             super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
             .
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (ppVar10 == ppVar3) {
      bVar8 = false;
    }
    else {
      do {
        ppVar9 = ppVar10 + 1;
        pCVar4 = unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>
                 ::operator->(&ppVar10->second);
        pSVar5 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
                 ::operator->(&pCVar4->query);
        pQVar6 = unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::
                 operator->(&pSVar5->node);
        bVar8 = true;
        if (pQVar6->type == RECURSIVE_CTE_NODE) break;
        ppVar10 = ppVar9;
        bVar8 = false;
      } while (ppVar9 != ppVar3);
    }
    local_48 = &__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_48;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"WITH ","");
    if (bVar8) {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    ppVar10 = (this->map).map.
              super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
              .
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_40 = (this->map).map.
               super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
               .
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if (ppVar10 != local_40) {
      paVar2 = &local_70.field_2;
      bVar8 = true;
      do {
        if (!bVar8) {
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        puVar1 = &ppVar10->second;
        this_00 = unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>
                  ::operator*(puVar1);
        KeywordHelper::WriteOptionallyQuoted(&local_70,&ppVar10->first,'\"',true);
        ::std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_70._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != paVar2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        local_50 = puVar1;
        if ((this_00->aliases).
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (this_00->aliases).
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          if ((this_00->aliases).
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              (this_00->aliases).
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            __n = 0;
            do {
              if (__n != 0) {
                ::std::__cxx11::string::append((char *)__return_storage_ptr__);
              }
              text = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                     ::operator[](&this_00->aliases,__n);
              KeywordHelper::WriteOptionallyQuoted(&local_70,text,'\"',true);
              ::std::__cxx11::string::_M_append
                        ((char *)__return_storage_ptr__,(ulong)local_70._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_70._M_dataplus._M_p != paVar2) {
                operator_delete(local_70._M_dataplus._M_p);
              }
              __n = __n + 1;
            } while (__n < (ulong)((long)(this_00->aliases).
                                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this_00->aliases).
                                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 5));
          }
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        if ((this_00->key_targets).
            super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (this_00->key_targets).
            super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          local_38 = ppVar10;
          if ((this_00->key_targets).
              super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              (this_00->key_targets).
              super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            __n_00 = 0;
            do {
              if (__n_00 != 0) {
                ::std::__cxx11::string::append((char *)__return_storage_ptr__);
              }
              this_01 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                        ::operator[](&this_00->key_targets,__n_00);
              pPVar7 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                       ::operator->(this_01);
              (*(pPVar7->super_BaseExpression)._vptr_BaseExpression[8])(&local_70,pPVar7);
              ::std::__cxx11::string::_M_append
                        ((char *)__return_storage_ptr__,(ulong)local_70._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_70._M_dataplus._M_p != paVar2) {
                operator_delete(local_70._M_dataplus._M_p);
              }
              __n_00 = __n_00 + 1;
            } while (__n_00 < (ulong)((long)(this_00->key_targets).
                                            super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                            .
                                            super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(this_00->key_targets).
                                            super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                            .
                                            super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 3));
          }
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          ppVar10 = local_38;
        }
        puVar1 = local_50;
        pCVar4 = unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>
                 ::operator->(local_50);
        if (pCVar4->materialized != CTE_MATERIALIZE_ALWAYS) {
          unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>
          ::operator->(puVar1);
        }
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        pSVar5 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
                 ::operator->(&this_00->query);
        (*(pSVar5->super_SQLStatement)._vptr_SQLStatement[2])(&local_70,pSVar5);
        ::std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_70._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != paVar2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        ppVar10 = ppVar10 + 1;
        bVar8 = false;
      } while (ppVar10 != local_40);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string CommonTableExpressionMap::ToString() const {
	if (map.empty()) {
		return string();
	}
	// check if there are any recursive CTEs
	bool has_recursive = false;
	for (auto &kv : map) {
		if (kv.second->query->node->type == QueryNodeType::RECURSIVE_CTE_NODE) {
			has_recursive = true;
			break;
		}
	}
	string result = "WITH ";
	if (has_recursive) {
		result += "RECURSIVE ";
	}
	bool first_cte = true;

	for (auto &kv : map) {
		if (!first_cte) {
			result += ", ";
		}
		auto &cte = *kv.second;
		result += KeywordHelper::WriteOptionallyQuoted(kv.first);
		if (!cte.aliases.empty()) {
			result += " (";
			for (idx_t k = 0; k < cte.aliases.size(); k++) {
				if (k > 0) {
					result += ", ";
				}
				result += KeywordHelper::WriteOptionallyQuoted(cte.aliases[k]);
			}
			result += ")";
		}
		if (!cte.key_targets.empty()) {
			result += " USING KEY (";
			for (idx_t k = 0; k < cte.key_targets.size(); k++) {
				if (k > 0) {
					result += ", ";
				}
				result += cte.key_targets[k]->ToString();
			}
			result += ") ";
		}
		if (kv.second->materialized == CTEMaterialize::CTE_MATERIALIZE_ALWAYS) {
			result += " AS MATERIALIZED (";
		} else if (kv.second->materialized == CTEMaterialize::CTE_MATERIALIZE_NEVER) {
			result += " AS NOT MATERIALIZED (";
		} else {
			result += " AS (";
		}
		result += cte.query->ToString();
		result += ")";
		first_cte = false;
	}
	return result;
}